

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinflate.c
# Opt level: O3

int tinf_inflate_block_data(tinf_data *d,tinf_tree *lt,tinf_tree *dt)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  ulong uVar7;
  
  while( true ) {
    while( true ) {
      uVar3 = tinf_decode_symbol(d,lt);
      if (d->overflow != 0) {
        return -3;
      }
      if (0xff < uVar3) break;
      puVar6 = d->dest;
      if (puVar6 == d->dest_end) {
        return -5;
      }
      d->dest = puVar6 + 1;
      *puVar6 = (uchar)uVar3;
    }
    if (uVar3 == 0x100) {
      return 0;
    }
    if (lt->max_sym < (int)uVar3) {
      return -3;
    }
    if (0x11d < uVar3) {
      return -3;
    }
    if (dt->max_sym == -1) {
      return -3;
    }
    uVar3 = uVar3 - 0x101;
    uVar1 = tinf_inflate_block_data::length_base[uVar3];
    uVar4 = 0;
    if ((0x100000ffUL >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      uVar4 = tinf_getbits(d,(uint)""[uVar3]);
    }
    uVar3 = tinf_decode_symbol(d,dt);
    if (0x1d < uVar3) {
      return -3;
    }
    if (dt->max_sym < (int)uVar3) {
      return -3;
    }
    uVar2 = tinf_inflate_block_data::dist_base[uVar3];
    uVar5 = 0;
    if (3 < uVar3) {
      uVar5 = tinf_getbits(d,(uint)""[uVar3]);
    }
    puVar6 = d->dest;
    if ((long)puVar6 - (long)d->dest_start < (long)(int)(uVar5 + uVar2)) break;
    uVar4 = uVar4 + uVar1;
    if ((long)d->dest_end - (long)puVar6 < (long)(int)uVar4) {
      return -5;
    }
    if (0 < (int)uVar4) {
      uVar7 = 0;
      do {
        d->dest[uVar7] = d->dest[uVar7 - (long)(int)(uVar5 + uVar2)];
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
      puVar6 = d->dest;
    }
    d->dest = puVar6 + (int)uVar4;
  }
  return -3;
}

Assistant:

static int tinf_inflate_block_data(struct tinf_data *d, struct tinf_tree *lt,
                                   struct tinf_tree *dt)
{
	/* Extra bits and base tables for length codes */
	static const unsigned char length_bits[30] = {
		0, 0, 0, 0, 0, 0, 0, 0, 1, 1,
		1, 1, 2, 2, 2, 2, 3, 3, 3, 3,
		4, 4, 4, 4, 5, 5, 5, 5, 0, 127
	};

	static const unsigned short length_base[30] = {
		 3,  4,  5,   6,   7,   8,   9,  10,  11,  13,
		15, 17, 19,  23,  27,  31,  35,  43,  51,  59,
		67, 83, 99, 115, 131, 163, 195, 227, 258,   0
	};

	/* Extra bits and base tables for distance codes */
	static const unsigned char dist_bits[30] = {
		0, 0,  0,  0,  1,  1,  2,  2,  3,  3,
		4, 4,  5,  5,  6,  6,  7,  7,  8,  8,
		9, 9, 10, 10, 11, 11, 12, 12, 13, 13
	};

	static const unsigned short dist_base[30] = {
		   1,    2,    3,    4,    5,    7,    9,    13,    17,    25,
		  33,   49,   65,   97,  129,  193,  257,   385,   513,   769,
		1025, 1537, 2049, 3073, 4097, 6145, 8193, 12289, 16385, 24577
	};

	for (;;) {
		int sym = tinf_decode_symbol(d, lt);

		/* Check for overflow in bit reader */
		if (d->overflow) {
			return TINF_DATA_ERROR;
		}

		if (sym < 256) {
			if (d->dest == d->dest_end) {
				return TINF_BUF_ERROR;
			}
			*d->dest++ = sym;
		}
		else {
			int length, dist, offs;
			int i;

			/* Check for end of block */
			if (sym == 256) {
				return TINF_OK;
			}

			/* Check sym is within range and distance tree is not empty */
			if (sym > lt->max_sym || sym - 257 > 28 || dt->max_sym == -1) {
				return TINF_DATA_ERROR;
			}

			sym -= 257;

			/* Possibly get more bits from length code */
			length = tinf_getbits_base(d, length_bits[sym],
			                           length_base[sym]);

			dist = tinf_decode_symbol(d, dt);

			/* Check dist is within range */
			if (dist > dt->max_sym || dist > 29) {
				return TINF_DATA_ERROR;
			}

			/* Possibly get more bits from distance code */
			offs = tinf_getbits_base(d, dist_bits[dist],
			                         dist_base[dist]);

			if (offs > d->dest - d->dest_start) {
				return TINF_DATA_ERROR;
			}

			if (d->dest_end - d->dest < length) {
				return TINF_BUF_ERROR;
			}

			/* Copy match */
			for (i = 0; i < length; ++i) {
				d->dest[i] = d->dest[i - offs];
			}

			d->dest += length;
		}
	}
}